

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_critbit.c
# Opt level: O0

void test_erase(CuTest *tc)

{
  int iVar1;
  char *pcVar2;
  char *str;
  critbit_tree cStack_18;
  int result;
  critbit_tree cb;
  CuTest *tc_local;
  
  cb.root = tc;
  memset(&stack0xffffffffffffffe8,0,8);
  iVar1 = cb_erase(&stack0xffffffffffffffe8,"herpderp",9);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x59,(char *)0x0,2,iVar1);
  cb_insert(&stack0xffffffffffffffe8,"herp",5);
  cb_insert(&stack0xffffffffffffffe8,"derp",5);
  iVar1 = cb_erase(&stack0xffffffffffffffe8,"herp",5);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x5f,(char *)0x0,0,iVar1);
  pcVar2 = (char *)cb_find(&stack0xffffffffffffffe8,"herp",5);
  CuAssertStrEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x62,(char *)0x0,(char *)0x0,pcVar2);
  pcVar2 = (char *)cb_find(&stack0xffffffffffffffe8,"derp",5);
  CuAssertStrEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             100,(char *)0x0,"derp",pcVar2);
  iVar1 = cb_erase(&stack0xffffffffffffffe8,"derp",5);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x67,(char *)0x0,0,iVar1);
  CuAssertPtrEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x68,(char *)0x0,(void *)0x0,cStack_18.root);
  cb_clear(&stack0xffffffffffffffe8);
  return;
}

Assistant:

static void test_erase(CuTest * tc)
{
  critbit_tree cb = CRITBIT_TREE();
  int result;
  const char * str;

  result = cb_erase_str(&cb, "herpderp");
  CuAssertIntEquals(tc, CB_NOTFOUND, result);

  result = cb_insert_str(&cb, "herp");
  result = cb_insert_str(&cb, "derp");

  result = cb_erase_str(&cb, "herp");
  CuAssertIntEquals(tc, CB_SUCCESS, result);

  str = cb_find_str(&cb, "herp");
  CuAssertStrEquals(tc, NULL, str);
  str = cb_find_str(&cb, "derp");
  CuAssertStrEquals(tc, "derp", str);

  result = cb_erase_str(&cb, "derp");
  CuAssertIntEquals(tc, CB_SUCCESS, result);
  CuAssertPtrEquals(tc, NULL, cb.root);

  cb_clear(&cb);
}